

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipcommunication.c
# Opt level: O3

int ipcmd_send_msq(ipcmd_t *ipcmd,YPSpur_msg *data)

{
  int iVar1;
  int iVar2;
  
  iVar2 = -1;
  if ((ipcmd != (ipcmd_t *)0x0) && (iVar2 = -1, ipcmd->connection_error == 0)) {
    iVar1 = msgsnd(ipcmd->socket,data,0x30,0);
    iVar2 = 0x30;
    if (iVar1 < 0) {
      ipcmd->connection_error = 1;
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

int ipcmd_send_msq(struct ipcmd_t* ipcmd, YPSpur_msg* data)
{
  size_t len = YPSPUR_MSG_SIZE;

  if (ipcmd == NULL || ipcmd->connection_error)
    return -1;

  if (msgsnd(ipcmd->socket, data, len, 0) < 0)
  {
    ipcmd->connection_error = 1;
    return -1;
  }
  return len;
}